

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

TSTree * ts_parser_parse_string_encoding
                   (TSParser *self,TSTree *old_tree,char *string,uint32_t length,
                   TSInputEncoding encoding)

{
  TSInput input_00;
  TSTree *pTVar1;
  TSStringInput input;
  undefined4 uStack_14;
  char *local_10;
  uint32_t local_8;
  
  input_00._20_4_ = uStack_14;
  input_00.encoding = encoding;
  input_00.read = ts_string_input_read;
  input_00.payload = &local_10;
  local_10 = string;
  local_8 = length;
  pTVar1 = ts_parser_parse(self,old_tree,input_00);
  return pTVar1;
}

Assistant:

TSTree *ts_parser_parse_string_encoding(TSParser *self, const TSTree *old_tree,
                                        const char *string, uint32_t length, TSInputEncoding encoding) {
  TSStringInput input = {string, length};
  return ts_parser_parse(self, old_tree, (TSInput) {
    &input,
    ts_string_input_read,
    encoding,
  });
}